

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

int32 Js::JavascriptOperators::OP_GetNativeIntElementI_Int32
                (Var instance,int32 index,ScriptContext *scriptContext)

{
  bool bVar1;
  int32 iVar2;
  ScriptContext *scriptContext_local;
  int32 index_local;
  Var instance_local;
  undefined8 local_10;
  
  bVar1 = TaggedInt::IsOverflow(index);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined((double)index,scriptContext);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(index);
  }
  iVar2 = OP_GetNativeIntElementI(instance,local_10);
  return iVar2;
}

Assistant:

int32 JavascriptOperators::OP_GetNativeIntElementI_Int32(Var instance, int32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_GetNativeIntElementI_Int32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_GetNativeIntElementI_Int32, Op_GetNativeIntElementI);
#if FLOATVAR
        return OP_GetNativeIntElementI(instance, Js::JavascriptNumber::ToVar(index, scriptContext));
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_GetNativeIntElementI(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer));
#endif
        JIT_HELPER_END(Op_GetNativeIntElementI_Int32);
    }